

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_template.cpp
# Opt level: O0

unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_> __thiscall
pfederc::Parser::fromExprToTemplateDecl
          (Parser *this,unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *rhs)

{
  bool bVar1;
  type pEVar2;
  pointer pEVar3;
  Expr *expr;
  unique_ptr *in_RDX;
  pointer local_e8;
  pointer local_b0;
  undefined1 local_78 [16];
  unique_ptr<pfederc::TokenExpr,_std::default_delete<pfederc::TokenExpr>_> local_68;
  Position local_60;
  BiOpExpr *local_48;
  BiOpExpr *bioprhs;
  unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
  local_38;
  undefined1 local_30 [8];
  unique_ptr<pfederc::TokenExpr,_std::default_delete<pfederc::TokenExpr>_> local_28;
  unique_ptr *local_20;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *rhs_local;
  Parser *this_local;
  
  local_20 = in_RDX;
  rhs_local = rhs;
  this_local = this;
  bVar1 = std::unique_ptr::operator_cast_to_bool(in_RDX);
  if (bVar1) {
    pEVar2 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                       ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_20);
    bVar1 = isTokenExpr(pEVar2,TOK_ID);
    if (bVar1) {
      pEVar3 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::release
                         ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_20
                         );
      if (pEVar3 == (pointer)0x0) {
        local_b0 = (pointer)0x0;
      }
      else {
        local_b0 = (pointer)__dynamic_cast(pEVar3,&Expr::typeinfo,&TokenExpr::typeinfo,0);
      }
      std::unique_ptr<pfederc::TokenExpr,std::default_delete<pfederc::TokenExpr>>::
      unique_ptr<std::default_delete<pfederc::TokenExpr>,void>
                ((unique_ptr<pfederc::TokenExpr,std::default_delete<pfederc::TokenExpr>> *)&local_28
                 ,local_b0);
      std::
      make_unique<pfederc::TemplateDecl,std::unique_ptr<pfederc::TokenExpr,std::default_delete<pfederc::TokenExpr>>>
                ((unique_ptr<pfederc::TokenExpr,_std::default_delete<pfederc::TokenExpr>_> *)this);
      std::unique_ptr<pfederc::TokenExpr,_std::default_delete<pfederc::TokenExpr>_>::~unique_ptr
                (&local_28);
    }
    else {
      pEVar2 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                         ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_20
                         );
      bVar1 = isBiOpExpr(pEVar2,TOK_OP_DCL);
      if (bVar1) {
        pEVar2 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                           ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                            local_20);
        local_48 = (BiOpExpr *)__dynamic_cast(pEVar2,&Expr::typeinfo,&BiOpExpr::typeinfo,0);
        if (local_48 == (BiOpExpr *)0x0) {
          __cxa_bad_cast();
        }
        expr = BiOpExpr::getLeft(local_48);
        bVar1 = isTokenExpr(expr,TOK_ID);
        if (bVar1) {
          BiOpExpr::getLeftPtr((BiOpExpr *)(local_78 + 8));
          pEVar3 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::release
                             ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                              (local_78 + 8));
          if (pEVar3 == (pointer)0x0) {
            local_e8 = (pointer)0x0;
          }
          else {
            local_e8 = (pointer)__dynamic_cast(pEVar3,&Expr::typeinfo,&TokenExpr::typeinfo,0);
          }
          std::unique_ptr<pfederc::TokenExpr,std::default_delete<pfederc::TokenExpr>>::
          unique_ptr<std::default_delete<pfederc::TokenExpr>,void>
                    ((unique_ptr<pfederc::TokenExpr,std::default_delete<pfederc::TokenExpr>> *)
                     &local_68,local_e8);
          BiOpExpr::getRightPtr((BiOpExpr *)local_78);
          std::
          make_unique<pfederc::TemplateDecl,std::unique_ptr<pfederc::TokenExpr,std::default_delete<pfederc::TokenExpr>>,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
                    ((unique_ptr<pfederc::TokenExpr,_std::default_delete<pfederc::TokenExpr>_> *)
                     this,(unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                          &local_68);
          std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                    ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_78);
          std::unique_ptr<pfederc::TokenExpr,_std::default_delete<pfederc::TokenExpr>_>::~unique_ptr
                    (&local_68);
          std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                    ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                     (local_78 + 8));
        }
        else {
          local_60.line._6_2_ = 2;
          local_60.line._0_4_ = EXPR_LAMBDA;
          Expr::getPosition(&local_48->super_Expr);
          std::
          make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                    ((Level *)&local_60.startIndex,(SyntaxErrorCode *)((long)&local_60.line + 6),
                     &local_60);
          generateError((Parser *)&local_60.endIndex,
                        (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)rhs);
          std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                     &local_60.endIndex);
          std::
          unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
          ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)&local_60.startIndex);
          std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>::
          unique_ptr<std::default_delete<pfederc::TemplateDecl>,void>
                    ((unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>> *
                     )this,(nullptr_t)0x0);
        }
      }
      else {
        bioprhs._6_2_ = 2;
        bioprhs._0_4_ = 9;
        pEVar3 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                           ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                            local_20);
        Expr::getPosition(pEVar3);
        std::
        make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                  ((Level *)&local_38,(SyntaxErrorCode *)((long)&bioprhs + 6),(Position *)&bioprhs);
        generateError((Parser *)local_30,
                      (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                       *)rhs);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   local_30);
        std::
        unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
        ::~unique_ptr(&local_38);
        std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>::
        unique_ptr<std::default_delete<pfederc::TemplateDecl>,void>
                  ((unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>> *)
                   this,(nullptr_t)0x0);
      }
    }
  }
  else {
    std::unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>>::
    unique_ptr<std::default_delete<pfederc::TemplateDecl>,void>
              ((unique_ptr<pfederc::TemplateDecl,std::default_delete<pfederc::TemplateDecl>> *)this,
               (nullptr_t)0x0);
  }
  return (__uniq_ptr_data<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>,_true,_true>
          )(__uniq_ptr_data<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<TemplateDecl> Parser::fromExprToTemplateDecl(std::unique_ptr<Expr> &&rhs) noexcept {
  if (!rhs) {
    return nullptr;
  }

  if (isTokenExpr(*rhs, TokenType::TOK_ID)) {
    return std::make_unique<TemplateDecl>(std::unique_ptr<TokenExpr>(
          dynamic_cast<TokenExpr*>(rhs.release())));
  }

  if (!isBiOpExpr(*rhs, TokenType::TOK_OP_DCL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_VARDECL, rhs->getPosition()));
    return nullptr;
  }

  BiOpExpr& bioprhs = dynamic_cast<BiOpExpr&>(*rhs);

  if (!isTokenExpr(bioprhs.getLeft(), TokenType::TOK_ID)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR, SyntaxErrorCode::STX_ERR_INVALID_VARDECL_ID, bioprhs.getPosition()));
    return nullptr;
  }
  
  return std::make_unique<TemplateDecl>(
    std::unique_ptr<TokenExpr>(dynamic_cast<TokenExpr*>(bioprhs.getLeftPtr().release())),
    bioprhs.getRightPtr());
}